

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

char * sx_EOL_LF(char *dest,int dest_sz,char *src)

{
  char cVar1;
  char *pcVar2;
  
  if (0 < dest_sz) {
    pcVar2 = dest + ((ulong)(uint)dest_sz - 1);
    while ((cVar1 = *src, cVar1 != '\0' && (dest < pcVar2))) {
      src = src + 1;
      if (cVar1 != '\r') {
        *dest = cVar1;
        dest = dest + 1;
      }
    }
    *dest = '\0';
    return dest;
  }
  __assert_fail("dest_sz > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/string.c",0x26f,
                "char *sx_EOL_LF(char *, int, const char *)");
}

Assistant:

char* sx_EOL_LF(char* dest, int dest_sz, const char* src)
{
    assert(dest_sz > 0);
    char* end = dest + dest_sz - 1;
    for (char ch = *src++; ch != '\0' && dest < end; ch = *src++) {
        if ('\r' != ch)
            *dest++ = ch;
    }
    *dest = '\0';
    return dest;
}